

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# runtest.c
# Opt level: O0

int saxParseTest(char *filename,char *result,char *err,int options)

{
  int iVar1;
  char *__filename;
  undefined8 uVar2;
  undefined8 *puVar3;
  int local_78;
  int local_74;
  xmlParserCtxtPtr ctxt_3;
  debugContext userData;
  htmlParserCtxtPtr ctxt_2;
  xmlParserCtxtPtr ctxt_1;
  htmlParserCtxtPtr ctxt;
  char *temp;
  int ret;
  int options_local;
  char *err_local;
  char *result_local;
  char *filename_local;
  
  nb_tests = nb_tests + 1;
  __filename = resultFilename(filename,temp_directory,".res");
  if (__filename == (char *)0x0) {
    fprintf(_stderr,"out of memory\n");
    fatalError();
  }
  SAXdebug = (FILE *)fopen64(__filename,"wb");
  if ((FILE *)SAXdebug == (FILE *)0x0) {
    fprintf(_stderr,"Failed to write to %s\n",__filename);
    free(__filename);
    filename_local._4_4_ = -1;
  }
  else {
    if ((options & 0x40000000U) == 0) {
      puVar3 = (undefined8 *)xmlCreateFileParserCtxt(filename);
      memcpy((void *)*puVar3,emptySAXHandler,0x100);
      xmlCtxtUseOptions(puVar3,options);
      xmlParseDocument(puVar3);
      if (*(int *)(puVar3 + 3) == 0) {
        local_74 = *(int *)(puVar3 + 0x11);
      }
      else {
        local_74 = 0;
      }
      temp._0_4_ = local_74;
      xmlFreeDoc(puVar3[2]);
      xmlFreeParserCtxt(puVar3);
    }
    else {
      uVar2 = htmlNewSAXParserCtxt(emptySAXHandler,0);
      htmlCtxtReadFile(uVar2,filename,0,options);
      htmlFreeParserCtxt(uVar2);
      temp._0_4_ = 0;
    }
    if ((int)temp == 0x1a) {
      fprintf((FILE *)SAXdebug,"xmlParseDocument returned error %d\n",0x1a);
      temp._0_4_ = 0;
    }
    if ((int)temp == 0) {
      if ((options & 0x40000000U) == 0) {
        puVar3 = (undefined8 *)xmlCreateFileParserCtxt(filename);
        if ((options & 0x200U) == 0) {
          memcpy((void *)*puVar3,debugSAX2Handler,0x100);
          temp._4_4_ = options;
        }
        else {
          memcpy((void *)*puVar3,debugSAXHandler,0x100);
          temp._4_4_ = options + -0x200;
        }
        ctxt_3 = (xmlParserCtxtPtr)filename;
        userData.filename = (char *)xmlHashCreate(0);
        userData.generalEntities = (xmlHashTablePtr)xmlHashCreate(0);
        puVar3[1] = &ctxt_3;
        xmlCtxtUseOptions(puVar3,temp._4_4_);
        xmlParseDocument(puVar3);
        if (*(int *)(puVar3 + 3) == 0) {
          local_78 = *(int *)(puVar3 + 0x11);
        }
        else {
          local_78 = 0;
        }
        temp._0_4_ = local_78;
        xmlHashFree(userData.filename,hashFreeEntity);
        xmlHashFree(userData.generalEntities,hashFreeEntity);
        xmlFreeDoc(puVar3[2]);
        xmlFreeParserCtxt(puVar3);
      }
      else {
        userData.parameterEntities = (xmlHashTablePtr)htmlNewSAXParserCtxt(debugHTMLSAXHandler,0);
        htmlCtxtReadFile(userData.parameterEntities,filename,0,options);
        htmlFreeParserCtxt(userData.parameterEntities);
        temp._0_4_ = 0;
      }
      fclose((FILE *)SAXdebug);
      iVar1 = compareFiles(__filename,result);
      if (iVar1 != 0) {
        fprintf(_stderr,"Got a difference for %s\n",filename);
        temp._0_4_ = 1;
      }
    }
    else {
      fprintf(_stderr,"Failed to parse %s\n",filename);
      temp._0_4_ = 1;
    }
    if (__filename != (char *)0x0) {
      unlink(__filename);
      free(__filename);
    }
    filename_local._4_4_ = (int)temp;
  }
  return filename_local._4_4_;
}

Assistant:

static int
saxParseTest(const char *filename, const char *result,
             const char *err ATTRIBUTE_UNUSED,
             int options) {
    int ret;
    char *temp;

    nb_tests++;
    temp = resultFilename(filename, temp_directory, ".res");
    if (temp == NULL) {
        fprintf(stderr, "out of memory\n");
        fatalError();
    }
    SAXdebug = fopen(temp, "wb");
    if (SAXdebug == NULL) {
        fprintf(stderr, "Failed to write to %s\n", temp);
	free(temp);
	return(-1);
    }

#ifdef LIBXML_HTML_ENABLED
    if (options & XML_PARSE_HTML) {
        htmlParserCtxtPtr ctxt;

        ctxt = htmlNewSAXParserCtxt(emptySAXHandler, NULL);
        htmlCtxtReadFile(ctxt, filename, NULL, options);
        htmlFreeParserCtxt(ctxt);
	ret = 0;
    } else
#endif
    {
        xmlParserCtxtPtr ctxt = xmlCreateFileParserCtxt(filename);
        memcpy(ctxt->sax, emptySAXHandler, sizeof(xmlSAXHandler));
        xmlCtxtUseOptions(ctxt, options);
        xmlParseDocument(ctxt);
        ret = ctxt->wellFormed ? 0 : ctxt->errNo;
        xmlFreeDoc(ctxt->myDoc);
        xmlFreeParserCtxt(ctxt);
    }
    if (ret == XML_ERR_UNDECLARED_ENTITY) {
        fprintf(SAXdebug, "xmlParseDocument returned error %d\n", ret);
        ret = 0;
    }
    if (ret != 0) {
        fprintf(stderr, "Failed to parse %s\n", filename);
	ret = 1;
	goto done;
    }
#ifdef LIBXML_HTML_ENABLED
    if (options & XML_PARSE_HTML) {
        htmlParserCtxtPtr ctxt;

        ctxt = htmlNewSAXParserCtxt(debugHTMLSAXHandler, NULL);
        htmlCtxtReadFile(ctxt, filename, NULL, options);
        htmlFreeParserCtxt(ctxt);
	ret = 0;
    } else
#endif
    {
        debugContext userData;
        xmlParserCtxtPtr ctxt = xmlCreateFileParserCtxt(filename);

        if (options & XML_PARSE_SAX1) {
            memcpy(ctxt->sax, debugSAXHandler, sizeof(xmlSAXHandler));
            options -= XML_PARSE_SAX1;
        } else {
            memcpy(ctxt->sax, debugSAX2Handler, sizeof(xmlSAXHandler));
        }
        userData.filename = filename;
        userData.generalEntities = xmlHashCreate(0);
        userData.parameterEntities = xmlHashCreate(0);
        ctxt->userData = &userData;
        xmlCtxtUseOptions(ctxt, options);
        xmlParseDocument(ctxt);
        ret = ctxt->wellFormed ? 0 : ctxt->errNo;
        xmlHashFree(userData.generalEntities, hashFreeEntity);
        xmlHashFree(userData.parameterEntities, hashFreeEntity);
        xmlFreeDoc(ctxt->myDoc);
        xmlFreeParserCtxt(ctxt);
    }
    fclose(SAXdebug);
    if (compareFiles(temp, result)) {
        fprintf(stderr, "Got a difference for %s\n", filename);
        ret = 1;
    }

done:
    if (temp != NULL) {
        unlink(temp);
        free(temp);
    }

    return(ret);
}